

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::PointerReader::getCapability(PointerReader *this)

{
  undefined8 *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  WirePointer *local_40;
  WirePointer *ref;
  PointerReader *this_local;
  
  if (in_RSI[2] == 0) {
    local_40 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_40 = (WirePointer *)in_RSI[2];
  }
  OVar1 = WireHelpers::readCapabilityPointer
                    ((WireHelpers *)this,(SegmentReader *)*in_RSI,(CapTableReader *)in_RSI[1],
                     local_40,*(int *)(in_RSI + 3));
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> PointerReader::getCapability() const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readCapabilityPointer(segment, capTable, ref, nestingLimit);
}